

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reorganize.cpp
# Opt level: O0

void __thiscall adios2::utils::Reorganize::Reorganize(Reorganize *this,int argc,char **argv)

{
  char *pcVar1;
  undefined4 uVar2;
  int *piVar3;
  long lVar4;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  string errmsg_1;
  int i;
  int prod;
  string errmsg;
  char *end;
  int j;
  int nd;
  Reorganize *in_stack_fffffffffffff970;
  allocator *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff978;
  int *in_stack_fffffffffffff980;
  allocator *in_stack_fffffffffffff988;
  Reorganize *in_stack_fffffffffffff990;
  allocator *in_stack_fffffffffffff9a0;
  allocator *in_stack_fffffffffffff9a8;
  allocator *in_stack_fffffffffffff9b0;
  int commRank;
  allocator *in_stack_fffffffffffff9b8;
  Utils *in_stack_fffffffffffff9c0;
  allocator *in_stack_fffffffffffff9c8;
  undefined7 in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d7;
  undefined1 uVar6;
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [36];
  int local_3dc;
  int local_3d8;
  allocator local_3d1;
  string local_3d0 [39];
  undefined1 local_3a9 [40];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  char *local_1f8;
  int local_1ec;
  int local_1e8;
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [32];
  Comm local_58 [31];
  allocator local_39;
  string local_38 [32];
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"adios_reorganize",&local_39);
  Utils::Utils(in_stack_fffffffffffff9c0,(string *)in_stack_fffffffffffff9b8,
               (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20),(char **)in_stack_fffffffffffff9a8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  *in_RDI = &PTR__Reorganize_00139d10;
  std::__cxx11::string::string((string *)(in_RDI + 0xe));
  std::__cxx11::string::string((string *)(in_RDI + 0x12));
  std::__cxx11::string::string((string *)(in_RDI + 0x16));
  std::__cxx11::string::string((string *)(in_RDI + 0x1a));
  std::__cxx11::string::string((string *)(in_RDI + 0x1e));
  std::__cxx11::string::string((string *)(in_RDI + 0x22));
  std::__cxx11::string::string((string *)(in_RDI + 0x26));
  *(undefined4 *)(in_RDI + 0x2a) = 0;
  *(undefined4 *)((long)in_RDI + 0x154) = 1;
  adios2::helper::Comm::Comm((Comm *)(in_RDI + 0x2b));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x11b76a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x11b786);
  in_RDI[0x38] = 0;
  in_RDI[0x39] = 0;
  *(undefined1 *)(in_RDI + 0x3a) = 1;
  *(undefined8 *)((long)in_RDI + 500) = 0x100000001;
  *(undefined8 *)((long)in_RDI + 0x1e4) = 0x100000001;
  *(undefined8 *)((long)in_RDI + 0x1ec) = 0x100000001;
  *(undefined8 *)((long)in_RDI + 0x1d4) = 0x100000001;
  *(undefined8 *)((long)in_RDI + 0x1dc) = 0x100000001;
  adios2::helper::CommDummy();
  adios2::helper::Comm::operator=((Comm *)(in_RDI + 0x2b),local_58);
  adios2::helper::Comm::~Comm(local_58);
  uVar2 = adios2::helper::Comm::Rank();
  *(undefined4 *)(in_RDI + 0x2a) = uVar2;
  uVar2 = adios2::helper::Comm::Size();
  *(undefined4 *)((long)in_RDI + 0x154) = uVar2;
  if (local_c < 7) {
    PrintUsage(in_stack_fffffffffffff970);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Utils",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"AdiosReorganize",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Reorganize",&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Not enough arguments. At least 6 are required",&local_f1)
    ;
    helper::Throw<std::invalid_argument>
              ((string *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
               (string *)in_stack_fffffffffffff9c8,(string *)in_stack_fffffffffffff9c0,
               (string *)in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  pcVar1 = *(char **)(local_18 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,pcVar1,&local_119);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x12),local_118);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  pcVar1 = *(char **)(local_18 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,pcVar1,&local_141);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x16),local_140);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  pcVar1 = *(char **)(local_18 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,pcVar1,&local_169);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x22),local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  pcVar1 = *(char **)(local_18 + 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,pcVar1,&local_191);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x26),local_190);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  pcVar1 = *(char **)(local_18 + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,pcVar1,&local_1b9);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1a),local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  pcVar1 = *(char **)(local_18 + 0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,pcVar1,&local_1e1);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1e),local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  local_1e8 = 0;
  local_1ec = 7;
  while( true ) {
    commRank = (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20);
    uVar6 = local_1ec < local_c && local_1ec < 0xd;
    if (local_1ec >= local_c || local_1ec >= 0xd) break;
    piVar3 = __errno_location();
    *piVar3 = 0;
    lVar4 = strtol(*(char **)(local_18 + (long)local_1ec * 8),&local_1f8,10);
    *(int *)((long)in_RDI + (long)local_1e8 * 4 + 0x1d4) = (int)lVar4;
    piVar3 = __errno_location();
    if ((*piVar3 != 0) || ((local_1f8 != (char *)0x0 && (*local_1f8 != '\0')))) {
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
      std::operator+((char *)in_stack_fffffffffffff978,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff970);
      std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
      in_stack_fffffffffffff9c0 = *(Utils **)(local_18 + (long)local_1ec * 8);
      in_stack_fffffffffffff9c8 = &local_2b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2b8,(char *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9a0);
      std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_2b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::string::~string(local_298);
      PrintUsage(in_stack_fffffffffffff970);
      in_stack_fffffffffffff9b8 = &local_2e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e0,"Utils",in_stack_fffffffffffff9b8);
      in_stack_fffffffffffff9b0 = &local_309;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_308,"AdiosReorganize",in_stack_fffffffffffff9b0);
      in_stack_fffffffffffff9a8 = &local_331;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_330,"Reorganize",in_stack_fffffffffffff9a8);
      helper::Throw<std::invalid_argument>
                ((string *)CONCAT17(uVar6,in_stack_fffffffffffff9d0),
                 (string *)in_stack_fffffffffffff9c8,(string *)in_stack_fffffffffffff9c0,
                 (string *)in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20)
                );
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
      std::__cxx11::string::~string(local_308);
      std::allocator<char>::~allocator((allocator<char> *)&local_309);
      std::__cxx11::string::~string(local_2e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
      std::__cxx11::string::~string(local_218);
    }
    local_1e8 = local_1e8 + 1;
    local_1ec = local_1ec + 1;
  }
  if (local_1ec < local_c) {
    in_stack_fffffffffffff9a0 = &local_359;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_358,"Utils",in_stack_fffffffffffff9a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_380,"AdiosReorganize",&local_381);
    in_stack_fffffffffffff990 = (Reorganize *)local_3a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_3a9 + 1),"Reorganize",(allocator *)in_stack_fffffffffffff990);
    in_stack_fffffffffffff988 = &local_3d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3d0,"Up to 6 decomposition arguments are supported",in_stack_fffffffffffff988);
    helper::Throw<std::invalid_argument>
              ((string *)CONCAT17(uVar6,in_stack_fffffffffffff9d0),
               (string *)in_stack_fffffffffffff9c8,(string *)in_stack_fffffffffffff9c0,
               (string *)in_stack_fffffffffffff9b8,commRank);
    std::__cxx11::string::~string(local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    std::__cxx11::string::~string((string *)(local_3a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3a9);
    std::__cxx11::string::~string(local_380);
    std::allocator<char>::~allocator((allocator<char> *)&local_381);
    std::__cxx11::string::~string(local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
  }
  local_3d8 = 1;
  for (local_3dc = 0; local_3dc < local_1e8; local_3dc = local_3dc + 1) {
    local_3d8 = *(int *)((long)in_RDI + (long)local_3dc * 4 + 0x1d4) * local_3d8;
  }
  if (*(int *)((long)in_RDI + 0x154) < local_3d8) {
    print0<char_const(&)[69],int&,int&>
              (in_stack_fffffffffffff990,(char (*) [69])in_stack_fffffffffffff988,
               in_stack_fffffffffffff980,(int *)in_stack_fffffffffffff978);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffff978,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff970);
    std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9a0);
    std::operator+(in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970);
    std::__cxx11::string::~string(local_420);
    std::__cxx11::string::~string(local_4a0);
    std::__cxx11::string::~string(local_440);
    std::__cxx11::string::~string(local_460);
    std::__cxx11::string::~string(local_480);
    PrintUsage(in_stack_fffffffffffff970);
    paVar5 = &local_4c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c0,"Utils",paVar5);
    paVar5 = &local_4e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e8,"AdiosReorganize",paVar5);
    paVar5 = &local_511;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_510,"Reorganize",paVar5);
    helper::Throw<std::invalid_argument>
              ((string *)CONCAT17(uVar6,in_stack_fffffffffffff9d0),
               (string *)in_stack_fffffffffffff9c8,(string *)in_stack_fffffffffffff9c0,
               (string *)in_stack_fffffffffffff9b8,commRank);
    std::__cxx11::string::~string(local_510);
    std::allocator<char>::~allocator((allocator<char> *)&local_511);
    std::__cxx11::string::~string(local_4e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
    std::__cxx11::string::~string(local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    std::__cxx11::string::~string(local_400);
  }
  return;
}

Assistant:

Reorganize::Reorganize(int argc, char *argv[]) : Utils("adios_reorganize", argc, argv)
{
#if ADIOS2_USE_MPI
    {
        auto commWorld = helper::CommWithMPI(MPI_COMM_WORLD);
        m_Comm = commWorld.Split(m_CommSplitColor, 0);
    }
#else
    m_Comm = helper::CommDummy();
#endif
    m_Rank = m_Comm.Rank();
    m_Size = m_Comm.Size();

    if (argc < 7)
    {
        PrintUsage();
        helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize",
                                             "Not enough arguments. At least 6 are required");
    }
    infilename = std::string(argv[1]);
    outfilename = std::string(argv[2]);
    rmethodname = std::string(argv[3]);
    rmethodparam_str = std::string(argv[4]);
    wmethodname = std::string(argv[5]);
    wmethodparam_str = std::string(argv[6]);

    int nd = 0;
    int j = 7;
    char *end;
    while (argc > j && j < 13)
    { // get max 6 dimensions
        errno = 0;
        decomp_values[nd] = std::strtol(argv[j], &end, 10);
        if (errno || (end != 0 && *end != '\0'))
        {
            std::string errmsg("ERROR: Invalid decomposition number in argument " +
                               std::to_string(j) + ": '" + std::string(argv[j]) + "'\n");
            PrintUsage();
            helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize", errmsg);
        }
        nd++;
        j++;
    }

    if (argc > j)
    {
        helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize",
                                             "Up to 6 decomposition arguments are supported");
    }

    int prod = 1;
    for (int i = 0; i < nd; i++)
    {
        prod *= decomp_values[i];
    }

    if (prod > m_Size)
    {
        print0("ERROR: Product of decomposition numbers %d > number of "
               "processes %d\n",
               prod, m_Size);
        std::string errmsg("ERROR: The product of decomposition numbers " + std::to_string(prod) +
                           " > number of processes " + std::to_string(m_Size) + "\n");
        PrintUsage();
        helper::Throw<std::invalid_argument>("Utils", "AdiosReorganize", "Reorganize", errmsg);
    }
}